

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

int __thiscall fmt::SystemError::init(SystemError *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  runtime_error *base;
  MemoryWriter w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  BasicStringRef<char> *in_stack_fffffffffffffcf0;
  BasicMemoryWriter<char,_std::allocator<char>_> *this_00;
  allocator<char> *alloc;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  BasicWriter<char> *in_stack_fffffffffffffd28;
  runtime_error local_2d0 [16];
  SystemError *local_2c0;
  string local_298 [71];
  allocator<char> local_251 [425];
  ArgList in_stack_ffffffffffffff58;
  CStringRef in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffffac;
  Writer *in_stack_ffffffffffffffb0;
  StringRef in_stack_ffffffffffffffb8;
  
  this->error_code_ = (int)ctx;
  alloc = local_251;
  std::allocator<char>::allocator();
  BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter(in_stack_fffffffffffffd10,alloc)
  ;
  std::allocator<char>::~allocator(local_251);
  format_abi_cxx11_(in_stack_ffffffffffffff68,in_stack_ffffffffffffff58);
  BasicStringRef<char>::BasicStringRef(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  this_00 = (BasicMemoryWriter<char,_std::allocator<char>_> *)(local_251 + 1);
  internal::format_system_error
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_298);
  local_2c0 = this;
  BasicWriter<char>::str_abi_cxx11_(in_stack_fffffffffffffd28);
  std::runtime_error::runtime_error(local_2d0,(string *)&stack0xfffffffffffffd10);
  std::runtime_error::operator=((runtime_error *)local_2c0,local_2d0);
  std::runtime_error::~runtime_error(local_2d0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd10);
  BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this_00);
  return extraout_EAX;
}

Assistant:

FMT_FUNC void fmt::SystemError::init(
    int err_code, CStringRef format_str, ArgList args) {
  error_code_ = err_code;
  MemoryWriter w;
  internal::format_system_error(w, err_code, format(format_str, args));
  std::runtime_error &base = *this;
  base = std::runtime_error(w.str());
}